

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

TokenType __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
checkIntLiteralRange
          (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
           *this,bool isNegative)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  CompileMessage local_a0;
  CompileMessage local_58;
  byte local_19;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  *pTStack_18;
  bool isNegative_local;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  *this_local;
  
  local_19 = isNegative;
  pTStack_18 = this;
  bVar2 = TokenType::operator==(&this->literalType,(TokenType *)&Token::literalInt32);
  if (bVar2) {
    if (((local_19 & 1) != 0) &&
       (lVar1 = this->literalIntValue, iVar3 = std::numeric_limits<int>::min(), -(long)iVar3 < lVar1
       )) {
      Errors::integerLiteralNeedsSuffix<>();
      (*this->_vptr_Tokeniser[2])(this,&local_58);
      CompileMessage::~CompileMessage(&local_58);
    }
    if (((local_19 & 1) == 0) &&
       (lVar1 = this->literalIntValue, iVar3 = std::numeric_limits<int>::max(), iVar3 < lVar1)) {
      Errors::integerLiteralNeedsSuffix<>();
      (*this->_vptr_Tokeniser[2])(this,&local_a0);
      CompileMessage::~CompileMessage(&local_a0);
    }
  }
  return (TokenType)(this->literalType).text;
}

Assistant:

TokenType checkIntLiteralRange (bool isNegative)
    {
        if (literalType == Token::literalInt32)
        {
            if (isNegative && literalIntValue > -static_cast<int64_t> (std::numeric_limits<int32_t>::min()))
                throwError (Errors::integerLiteralNeedsSuffix());

            if (! isNegative && literalIntValue > static_cast<int64_t> (std::numeric_limits<int32_t>::max()))
                throwError (Errors::integerLiteralNeedsSuffix());
        }

        return literalType;
    }